

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O2

void __thiscall xmrig::HttpClient::onResolved(HttpClient *this,Dns *dns,int status)

{
  ushort uVar1;
  char *pcVar2;
  DnsRecord *this_00;
  sockaddr *psVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  
  (this->super_HttpContext).super_HttpData.status = status;
  if (((status < 0) &&
      ((dns->m_ipv4).super__Vector_base<xmrig::DnsRecord,_std::allocator<xmrig::DnsRecord>_>._M_impl
       .super__Vector_impl_data._M_start ==
       (dns->m_ipv4).super__Vector_base<xmrig::DnsRecord,_std::allocator<xmrig::DnsRecord>_>._M_impl
       .super__Vector_impl_data._M_finish)) &&
     ((dns->m_ipv6).super__Vector_base<xmrig::DnsRecord,_std::allocator<xmrig::DnsRecord>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (dns->m_ipv6).super__Vector_base<xmrig::DnsRecord,_std::allocator<xmrig::DnsRecord>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    if (this->m_quiet != false) {
      return;
    }
    pcVar2 = (dns->m_host).m_data;
    uVar1 = this->m_port;
    uVar5 = uv_strerror(status);
    Log::print(ERR,"[%s:%d] DNS error: \"%s\"",pcVar2,(ulong)uVar1,uVar5);
    return;
  }
  this_00 = Dns::get(dns,A);
  psVar3 = DnsRecord::addr(this_00,this->m_port);
  puVar4 = (undefined8 *)operator_new(0x60);
  *puVar4 = this;
  uv_tcp_connect(puVar4,(this->super_HttpContext).m_tcp,psVar3,onConnect);
  return;
}

Assistant:

void xmrig::HttpClient::onResolved(const Dns &dns, int status)
{
    this->status = status;

    if (status < 0 && dns.isEmpty()) {
        if (!m_quiet) {
            LOG_ERR("[%s:%d] DNS error: \"%s\"", dns.host().data(), m_port, uv_strerror(status));
        }

        return;
    }

    sockaddr *addr = dns.get().addr(m_port);

    auto req  = new uv_connect_t;
    req->data = this;

    uv_tcp_connect(req, m_tcp, addr, onConnect);
}